

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ImageStoreCase::iterate(ImageStoreCase *this)

{
  pointer *pppSVar1;
  ChannelType CVar2;
  RenderContext *pRVar3;
  TestLog *log;
  bool bVar4;
  ImageStoreCase *pIVar5;
  bool bVar6;
  int iVar7;
  deUint32 dVar8;
  GLuint num_groups_z;
  ContextType type;
  GLSLVersion version;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *__s;
  ProgramSources *sources;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  GLuint GVar9;
  TextureType TVar10;
  RenderContext *renderContext;
  TextureFormat *format;
  uint z;
  int y;
  uint y_00;
  bool *__s_00;
  ChannelType formatType;
  Functional *this_00;
  int x;
  uint x_00;
  GLuint x_01;
  char *pcVar11;
  float fVar12;
  IVec3 local_674;
  RenderContext *local_668;
  float local_65c;
  float storeColorBias;
  float storeColorScale;
  undefined8 local_650;
  ImageStoreCase *local_648;
  CallLogWrapper glLog;
  undefined1 local_628 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  TextureFormat *local_5e0;
  Texture texture;
  string colorExpr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  TestLog *local_540;
  string local_538;
  string local_518;
  string local_4f8;
  string local_4d8;
  string glslVersionDeclaration;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  Buffer textureBuf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  string shaderImageTypeStr;
  string shaderImageFormatStr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  string local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  string colorBaseExpr;
  UniformAccessLogger uniforms;
  ShaderProgram program;
  IVec3 *imageSize;
  
  pRVar3 = ((this->super_TestCase).m_context)->m_renderCtx;
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar7 = (*pRVar3->_vptr_RenderContext[3])(pRVar3);
  glu::CallLogWrapper::CallLogWrapper(&glLog,(Functions *)CONCAT44(extraout_var,iVar7),log);
  dVar8 = glu::getInternalFormat(this->m_format);
  local_650 = CONCAT44(extraout_var_00,dVar8);
  TVar10 = this->m_textureType;
  dVar8 = getGLTextureTarget(TVar10);
  defaultImageSize((Functional *)&local_674,TVar10);
  num_groups_z = 6;
  if (this->m_textureType != TEXTURETYPE_CUBE) {
    num_groups_z = local_674.m_data[2];
  }
  GVar9 = local_674.m_data[2];
  if (local_674.m_data[2] < local_674.m_data[1]) {
    GVar9 = local_674.m_data[1];
  }
  if ((int)GVar9 < local_674.m_data[0]) {
    GVar9 = local_674.m_data[0];
  }
  CVar2 = (this->m_format).type;
  if ((CVar2 < UNORM_BYTE_44) && ((0x58U >> (CVar2 & UNSIGNED_INT16) & 1) != 0)) {
    fVar12 = 1.0;
LAB_0124a7c7:
    storeColorScale = fVar12 / (float)(int)(GVar9 - 1);
  }
  else {
    if (CVar2 < UNORM_INT8) {
      fVar12 = 2.0;
      goto LAB_0124a7c7;
    }
    storeColorScale = 1.0;
  }
  if (CVar2 < UNORM_INT8) {
    storeColorBias = -1.0;
  }
  else {
    storeColorBias = 0.0;
  }
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper(&textureBuf,pRVar3);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper(&texture,pRVar3);
  glLog.m_enableLog = true;
  pppSVar1 = &program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pppSVar1);
  std::operator<<((ostream *)pppSVar1,"// Created a texture (name ");
  std::ostream::_M_insert<unsigned_long>((ulong)pppSVar1);
  std::operator<<((ostream *)pppSVar1,")");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&program,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pppSVar1);
  if (this->m_textureType == TEXTURETYPE_BUFFER) {
    pppSVar1 = &program.m_shaders[0].
                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pppSVar1);
    std::operator<<((ostream *)pppSVar1,"// Created a buffer for the texture (name ");
    std::ostream::_M_insert<unsigned_long>((ulong)pppSVar1);
    std::operator<<((ostream *)pppSVar1,")");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&program,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pppSVar1);
  }
  glu::CallLogWrapper::glActiveTexture(&glLog,0x84c0);
  glu::CallLogWrapper::glBindTexture(&glLog,dVar8,texture.super_ObjectWrapper.m_object);
  setTexParameteri(&glLog,dVar8);
  imageSize = &local_674;
  setTextureStorage(&glLog,this->m_textureType,(deUint32)local_650,imageSize,
                    textureBuf.super_ObjectWrapper.m_object);
  TVar10 = (TextureType)imageSize;
  local_5e0 = &this->m_format;
  local_540 = log;
  getShaderImageFormatQualifier_abi_cxx11_(&shaderImageFormatStr,(Functional *)local_5e0,format);
  this_00 = (Functional *)(ulong)this->m_textureType;
  if (this->m_singleLayerBind == true) {
    if (this->m_textureType < TEXTURETYPE_LAST) {
      this_00 = (Functional *)(ulong)*(uint *)(&DAT_018a160c + (long)this_00 * 4);
    }
    else {
      this_00 = (Functional *)0x8;
    }
  }
  formatType = (ChannelType)this_00;
  getShaderImageType_abi_cxx11_
            (&shaderImageTypeStr,(Functional *)(ulong)(this->m_format).type,formatType,TVar10);
  CVar2 = (this->m_format).type;
  __s_00 = (bool *)0x18936c1;
  pcVar11 = glcts::fixed_sample_locations_values + 1;
  if (2 < CVar2 - SIGNED_INT8) {
    __s_00 = glcts::fixed_sample_locations_values + 1;
  }
  renderContext = (RenderContext *)0x1727a24;
  if ((CVar2 & ~SNORM_INT16) == UNSIGNED_INT8) {
    __s_00 = (bool *)0x1727a24;
  }
  if (CVar2 == UNSIGNED_INT32) {
    __s_00 = (bool *)0x1727a24;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5a0,__s_00,(allocator<char> *)&local_400);
  std::operator+(&glslVersionDeclaration,&local_5a0,"vec4(gx^gy^gz, (");
  local_380._M_dataplus._M_p._0_4_ = local_674.m_data[0] - 1;
  de::toString<int>(&local_4d8,(int *)&local_380);
  std::operator+(&local_498,&glslVersionDeclaration,&local_4d8);
  std::operator+(&local_580,&local_498,"-gx)^gy^gz, gx^(");
  local_3a0._M_dataplus._M_p._0_4_ = local_674.m_data[1] - 1;
  de::toString<int>(&local_4f8,(int *)&local_3a0);
  std::operator+(&local_560,&local_580,&local_4f8);
  std::operator+(&colorExpr,&local_560,"-gy)^gz, (");
  local_3c0._M_dataplus._M_p._0_4_ = local_674.m_data[0] - 1;
  de::toString<int>(&local_518,(int *)&local_3c0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_628,
                 &colorExpr,&local_518);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&uniforms,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_628,
                 "-gx)^(");
  local_3e0._M_dataplus._M_p._0_4_ = local_674.m_data[1] - 1;
  de::toString<int>(&local_538,(int *)&local_3e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&program,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&uniforms,
                 &local_538);
  std::operator+(&colorBaseExpr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&program,
                 "-gy)^gz)");
  std::__cxx11::string::~string((string *)&program);
  std::__cxx11::string::~string((string *)&local_538);
  std::__cxx11::string::~string((string *)&uniforms);
  std::__cxx11::string::~string((string *)local_628);
  std::__cxx11::string::~string((string *)&local_518);
  std::__cxx11::string::~string((string *)&colorExpr);
  std::__cxx11::string::~string((string *)&local_560);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::__cxx11::string::~string((string *)&local_580);
  std::__cxx11::string::~string((string *)&local_498);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::__cxx11::string::~string((string *)&glslVersionDeclaration);
  std::__cxx11::string::~string((string *)&local_5a0);
  local_668 = (RenderContext *)CONCAT44(local_668._4_4_,storeColorScale);
  if ((storeColorScale != 1.0) || (NAN(storeColorScale))) {
    de::toString<float>(&local_560,&storeColorScale);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&uniforms,
                   "*",&local_560);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&uniforms,glcts::fixed_sample_locations_values + 1,
               (allocator<char> *)&local_560);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&program,
                 &colorBaseExpr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&uniforms);
  local_65c = storeColorBias;
  if ((storeColorBias != 0.0) || (NAN(storeColorBias))) {
    de::toString<float>(&local_498,&storeColorBias);
    std::operator+(&local_580," + float(",&local_498);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_628,
                   &local_580,")");
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_628,glcts::fixed_sample_locations_values + 1,
               (allocator<char> *)&local_580);
  }
  std::operator+(&colorExpr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&program,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_628);
  std::__cxx11::string::~string((string *)local_628);
  if ((local_65c != 0.0) || (NAN(local_65c))) {
    std::__cxx11::string::~string((string *)&local_580);
    std::__cxx11::string::~string((string *)&local_498);
  }
  std::__cxx11::string::~string((string *)&program);
  std::__cxx11::string::~string((string *)&uniforms);
  if ((local_668._0_4_ != 1.0) || (NAN(local_668._0_4_))) {
    std::__cxx11::string::~string((string *)&local_560);
  }
  type.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])(pRVar3);
  version = glu::getContextTypeGLSLVersion(type);
  __s = glu::getGLSLVersionDeclaration(version);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&glslVersionDeclaration,__s,(allocator<char> *)&program);
  memset(&uniforms,0,0xac);
  std::operator+(&local_340,&glslVersionDeclaration,"\n");
  textureTypeExtensionShaderRequires_abi_cxx11_
            (&local_360,this_00,(TextureType)pRVar3,renderContext);
  std::operator+(&local_320,&local_340,&local_360);
  std::operator+(&local_300,&local_320,"\nprecision highp ");
  std::operator+(&local_2e0,&local_300,&shaderImageTypeStr);
  std::operator+(&local_2c0,&local_2e0,
                 ";\n\nlayout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\nlayout (")
  ;
  std::operator+(&local_400,&local_2c0,&shaderImageFormatStr);
  std::operator+(&local_3e0,&local_400,", binding=0) writeonly uniform ");
  std::operator+(&local_3c0,&local_3e0,&shaderImageTypeStr);
  std::operator+(&local_3a0,&local_3c0," u_image;\n");
  if (this->m_singleLayerBind != false) {
    pcVar11 = "uniform int u_layerNdx;\n";
  }
  std::operator+(&local_380,&local_3a0,pcVar11);
  std::operator+(&local_538,&local_380,
                 "\nvoid main (void)\n{\n\tint gx = int(gl_GlobalInvocationID.x);\n\tint gy = int(gl_GlobalInvocationID.y);\n\tint gz = "
                );
  pcVar11 = "int(gl_GlobalInvocationID.z)";
  if (this->m_singleLayerBind != false) {
    pcVar11 = "u_layerNdx";
  }
  std::operator+(&local_518,&local_538,pcVar11);
  std::operator+(&local_4f8,&local_518,";\n");
  local_668 = pRVar3;
  local_648 = this;
  if (formatType == UNORM_BYTE_44) {
    std::operator+(&local_600,"\timageStore(u_image, gx, ",&colorExpr);
    std::operator+(&local_460,&local_600,");\n");
    bVar4 = false;
LAB_0124afb7:
    bVar6 = false;
  }
  else if (formatType - SNORM_INT16 < 3) {
    std::operator+(&local_600,"\timageStore(u_image, ivec3(gx, gy, gz), ",&colorExpr);
    std::operator+(&local_460,&local_600,");\n");
    bVar6 = true;
    bVar4 = false;
  }
  else {
    if (formatType == SNORM_INT8) {
      std::operator+(&local_600,"\timageStore(u_image, ivec2(gx, gy), ",&colorExpr);
      std::operator+(&local_460,&local_600,");\n");
      bVar4 = true;
      goto LAB_0124afb7;
    }
    bVar4 = false;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_460,(char *)0x0,(allocator<char> *)&local_600);
    bVar6 = false;
  }
  std::operator+(&local_4d8,&local_4f8,&local_460);
  std::operator+(&local_5a0,&local_4d8,"}\n");
  glu::ComputeSource::ComputeSource((ComputeSource *)local_628,&local_5a0);
  sources = glu::ProgramSources::operator<<((ProgramSources *)&uniforms,(ShaderSource *)local_628);
  glu::ShaderProgram::ShaderProgram(&program,local_668,sources);
  std::__cxx11::string::~string((string *)(local_628 + 8));
  std::__cxx11::string::~string((string *)&local_5a0);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::__cxx11::string::~string((string *)&local_460);
  if (bVar6) {
    std::__cxx11::string::~string((string *)&local_600);
  }
  pRVar3 = local_668;
  if (bVar4) {
    std::__cxx11::string::~string((string *)&local_600);
  }
  if (formatType == UNORM_BYTE_44) {
    std::__cxx11::string::~string((string *)&local_600);
  }
  std::__cxx11::string::~string((string *)&local_4f8);
  std::__cxx11::string::~string((string *)&local_518);
  std::__cxx11::string::~string((string *)&local_538);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)&local_400);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::~string((string *)&local_320);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_340);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&uniforms);
  iVar7 = (*pRVar3->_vptr_RenderContext[3])(pRVar3);
  uniforms.m_gl = (Functions *)CONCAT44(extraout_var_01,iVar7);
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header;
  uniforms.m_log = local_540;
  uniforms.m_programGL = program.m_program.m_program;
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  glu::operator<<(local_540,&program);
  local_65c = (float)CONCAT31(local_65c._1_3_,program.m_program.m_info.linkOk);
  if (program.m_program.m_info.linkOk == false) {
    tcu::TestContext::setTestResult
              ((local_648->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Program compilation failed");
  }
  else {
    glu::CallLogWrapper::glUseProgram(&glLog,program.m_program.m_program);
    if (local_648->m_singleLayerBind == true) {
      x_01 = 0;
      GVar9 = 0;
      if (0 < (int)num_groups_z) {
        GVar9 = num_groups_z;
      }
      for (; GVar9 != x_01; x_01 = x_01 + 1) {
        if (x_01 != 0) {
          glu::CallLogWrapper::glMemoryBarrier(&glLog,0x20);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_628,"u_layerNdx",(allocator<char> *)&local_5a0);
        UniformAccessLogger::assign1i(&uniforms,(string *)local_628,x_01);
        std::__cxx11::string::~string((string *)local_628);
        glu::CallLogWrapper::glBindImageTexture
                  (&glLog,0,texture.super_ObjectWrapper.m_object,0,'\0',x_01,0x88b9,
                   (GLenum)local_650);
        iVar7 = (*local_668->_vptr_RenderContext[3])();
        dVar8 = (**(code **)(CONCAT44(extraout_var_02,iVar7) + 0x800))();
        glu::checkError(dVar8,"glBindImageTexture",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                        ,0x4cb);
        glu::CallLogWrapper::glDispatchCompute(&glLog,local_674.m_data[0],local_674.m_data[1],1);
        iVar7 = (*local_668->_vptr_RenderContext[3])();
        dVar8 = (**(code **)(CONCAT44(extraout_var_03,iVar7) + 0x800))();
        glu::checkError(dVar8,"glDispatchCompute",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                        ,0x4ce);
      }
    }
    else {
      glu::CallLogWrapper::glBindImageTexture
                (&glLog,0,texture.super_ObjectWrapper.m_object,0,'\x01',0,0x88b9,(GLenum)local_650);
      iVar7 = (*local_668->_vptr_RenderContext[3])();
      dVar8 = (**(code **)(CONCAT44(extraout_var_04,iVar7) + 0x800))();
      glu::checkError(dVar8,"glBindImageTexture",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                      ,0x4d4);
      glu::CallLogWrapper::glDispatchCompute
                (&glLog,local_674.m_data[0],local_674.m_data[1],num_groups_z);
      iVar7 = (*local_668->_vptr_RenderContext[3])();
      dVar8 = (**(code **)(CONCAT44(extraout_var_05,iVar7) + 0x800))();
      glu::checkError(dVar8,"glDispatchCompute",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                      ,0x4d7);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&uniforms.m_uniformLocations._M_t);
  glu::ShaderProgram::~ShaderProgram(&program);
  std::__cxx11::string::~string((string *)&glslVersionDeclaration);
  std::__cxx11::string::~string((string *)&colorExpr);
  std::__cxx11::string::~string((string *)&colorBaseExpr);
  std::__cxx11::string::~string((string *)&shaderImageTypeStr);
  std::__cxx11::string::~string((string *)&shaderImageFormatStr);
  if (local_65c._0_1_ == '\0') goto LAB_0124b63c;
  CVar2 = (local_648->m_format).type;
  if ((ulong)CVar2 < 0x22) {
    local_650 = CONCAT71(local_650._1_7_,1);
    if ((0x2c0000000U >> ((ulong)CVar2 & 0x3f) & 1) == 0) goto LAB_0124b456;
  }
  else {
LAB_0124b456:
    local_650 = CONCAT71(local_650._1_7_,CVar2 - SIGNED_INT8 < 3);
  }
  LayeredImage::LayeredImage
            ((LayeredImage *)&program,local_648->m_textureType,local_5e0,local_674.m_data[0],
             local_674.m_data[1],local_674.m_data[2]);
  z = 0;
  if ((int)num_groups_z < 1) {
    num_groups_z = 0;
  }
  for (; pIVar5 = local_648, z != num_groups_z; z = z + 1) {
    for (y_00 = 0; (int)y_00 < local_674.m_data[1]; y_00 = y_00 + 1) {
      iVar7 = -1;
      for (x_00 = 0; (int)x_00 < local_674.m_data[0]; x_00 = x_00 + 1) {
        uniforms.m_gl =
             (Functions *)CONCAT44(y_00 ^ z ^ local_674.m_data[0] + iVar7,y_00 ^ z ^ x_00);
        uniforms.m_log =
             (TestLog *)
             CONCAT44(local_674.m_data[0] + iVar7 ^ z ^ local_674.m_data[1] + ~y_00,
                      x_00 ^ z ^ local_674.m_data[1] + ~y_00);
        if ((char)local_650 == '\0') {
          tcu::Vector<int,_4>::cast<float>((Vector<int,_4> *)&shaderImageTypeStr);
          tcu::operator*((tcu *)&shaderImageFormatStr,storeColorScale,
                         (Vector<float,_4> *)&shaderImageTypeStr);
          tcu::operator+((tcu *)local_628,storeColorBias,(Vector<float,_4> *)&shaderImageFormatStr);
          Functional::(anonymous_namespace)::LayeredImage::setPixel<tcu::Vector<float,4>>
                    ((LayeredImage *)&program,x_00,y_00,z,(Vector<float,_4> *)local_628);
        }
        else {
          Functional::(anonymous_namespace)::LayeredImage::setPixel<tcu::Vector<int,4>>
                    ((LayeredImage *)&program,x_00,y_00,z,(Vector<int,_4> *)&uniforms);
        }
        iVar7 = iVar7 + -1;
      }
    }
  }
  TVar10 = local_648->m_textureType;
  local_628._0_8_ = (pointer)0x0;
  ImageLayerComparer::ImageLayerComparer
            ((ImageLayerComparer *)&uniforms,(LayeredImage *)&program,(IVec2 *)local_628);
  bVar6 = readTextureAndVerify
                    (local_668,&glLog,texture.super_ObjectWrapper.m_object,
                     textureBuf.super_ObjectWrapper.m_object,TVar10,local_5e0,&local_674,
                     (ImageLayerVerifier *)&uniforms);
  pcVar11 = "Image comparison failed";
  if (bVar6) {
    pcVar11 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((pIVar5->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar6,pcVar11);
  LayeredImage::~LayeredImage((LayeredImage *)&program);
LAB_0124b63c:
  glu::ObjectWrapper::~ObjectWrapper(&texture.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&textureBuf.super_ObjectWrapper);
  glu::CallLogWrapper::~CallLogWrapper(&glLog);
  return STOP;
}

Assistant:

ImageStoreCase::IterateResult ImageStoreCase::iterate (void)
{
	const RenderContext&		renderCtx				= m_context.getRenderContext();
	TestLog&					log						(m_testCtx.getLog());
	glu::CallLogWrapper			glLog					(renderCtx.getFunctions(), log);
	const deUint32				internalFormatGL		= glu::getInternalFormat(m_format);
	const deUint32				textureTargetGL			= getGLTextureTarget(m_textureType);
	const IVec3&				imageSize				= defaultImageSize(m_textureType);
	const int					numSlicesOrFaces		= m_textureType == TEXTURETYPE_CUBE ? 6 : imageSize.z();
	const int					maxImageDimension		= de::max(imageSize.x(), de::max(imageSize.y(), imageSize.z()));
	const float					storeColorScale			= isFormatTypeUnorm(m_format.type) ? 1.0f / (float)(maxImageDimension - 1)
														: isFormatTypeSnorm(m_format.type) ? 2.0f / (float)(maxImageDimension - 1)
														: 1.0f;
	const float					storeColorBias			= isFormatTypeSnorm(m_format.type) ? -1.0f : 0.0f;
	const glu::Buffer			textureBuf				(renderCtx); // \note Only really used if using buffer texture.
	const glu::Texture			texture					(renderCtx);

	glLog.enableLogging(true);

	// Setup texture.

	log << TestLog::Message << "// Created a texture (name " << *texture << ")" << TestLog::EndMessage;
	if (m_textureType == TEXTURETYPE_BUFFER)
		log << TestLog::Message << "// Created a buffer for the texture (name " << *textureBuf << ")" << TestLog::EndMessage;

	glLog.glActiveTexture(GL_TEXTURE0);
	glLog.glBindTexture(textureTargetGL, *texture);
	setTexParameteri(glLog, textureTargetGL);
	setTextureStorage(glLog, m_textureType, internalFormatGL, imageSize, *textureBuf);

	// Perform image stores in compute shader.

	{
		// Generate compute shader.

		const string		shaderImageFormatStr	= getShaderImageFormatQualifier(m_format);
		const TextureType	shaderImageType			= m_singleLayerBind ? textureLayerType(m_textureType) : m_textureType;
		const string		shaderImageTypeStr		= getShaderImageType(m_format.type, shaderImageType);
		const bool			isUintFormat			= isFormatTypeUnsignedInteger(m_format.type);
		const bool			isIntFormat				= isFormatTypeSignedInteger(m_format.type);
		const string		colorBaseExpr			= string(isUintFormat ? "u" : isIntFormat ? "i" : "") + "vec4(gx^gy^gz, "
																												 "(" + toString(imageSize.x()-1) + "-gx)^gy^gz, "
																												 "gx^(" + toString(imageSize.y()-1) + "-gy)^gz, "
																												 "(" + toString(imageSize.x()-1) + "-gx)^(" + toString(imageSize.y()-1) + "-gy)^gz)";
		const string		colorExpr				= colorBaseExpr + (storeColorScale == 1.0f ? "" : "*" + toString(storeColorScale))
																	+ (storeColorBias == 0.0f ? "" : " + float(" + toString(storeColorBias) + ")");
		const std::string	glslVersionDeclaration	= glu::getGLSLVersionDeclaration(glu::getContextTypeGLSLVersion(renderCtx.getType()));

		const glu::ShaderProgram program(renderCtx,
			glu::ProgramSources() << glu::ComputeSource(glslVersionDeclaration + "\n"
														+ textureTypeExtensionShaderRequires(shaderImageType, renderCtx) +
														"\n"
														"precision highp " + shaderImageTypeStr + ";\n"
														"\n"
														"layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
														"layout (" + shaderImageFormatStr + ", binding=0) writeonly uniform " + shaderImageTypeStr + " u_image;\n"
														+ (m_singleLayerBind ? "uniform int u_layerNdx;\n" : "") +
														"\n"
														"void main (void)\n"
														"{\n"
														"	int gx = int(gl_GlobalInvocationID.x);\n"
														"	int gy = int(gl_GlobalInvocationID.y);\n"
														"	int gz = " + (m_singleLayerBind ? "u_layerNdx" : "int(gl_GlobalInvocationID.z)") + ";\n"
														+ (shaderImageType == TEXTURETYPE_BUFFER ?
															"	imageStore(u_image, gx, " + colorExpr + ");\n"
														 : shaderImageType == TEXTURETYPE_2D ?
															"	imageStore(u_image, ivec2(gx, gy), " + colorExpr + ");\n"
														 : shaderImageType == TEXTURETYPE_3D || shaderImageType == TEXTURETYPE_CUBE || shaderImageType == TEXTURETYPE_2D_ARRAY ?
															"	imageStore(u_image, ivec3(gx, gy, gz), " + colorExpr + ");\n"
														 : DE_NULL) +
														"}\n"));

		UniformAccessLogger uniforms(renderCtx.getFunctions(), log, program.getProgram());

		log << program;

		if (!program.isOk())
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Program compilation failed");
			return STOP;
		}

		// Setup and dispatch.

		glLog.glUseProgram(program.getProgram());

		if (m_singleLayerBind)
		{
			for (int layerNdx = 0; layerNdx < numSlicesOrFaces; layerNdx++)
			{
				if (layerNdx > 0)
					glLog.glMemoryBarrier(GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);

				uniforms.assign1i("u_layerNdx", layerNdx);

				glLog.glBindImageTexture(0, *texture, 0, GL_FALSE, layerNdx, GL_WRITE_ONLY, internalFormatGL);
				GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");

				glLog.glDispatchCompute(imageSize.x(), imageSize.y(), 1);
				GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glDispatchCompute");
			}
		}
		else
		{
			glLog.glBindImageTexture(0, *texture, 0, GL_TRUE, 0, GL_WRITE_ONLY, internalFormatGL);
			GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");

			glLog.glDispatchCompute(imageSize.x(), imageSize.y(), numSlicesOrFaces);
			GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glDispatchCompute");
		}
	}

	// Create reference, read texture and compare to reference.
	{
		const int		isIntegerFormat		= isFormatTypeInteger(m_format.type);
		LayeredImage	reference			(m_textureType, m_format, imageSize.x(), imageSize.y(), imageSize.z());

		DE_ASSERT(!isIntegerFormat || (storeColorScale == 1.0f && storeColorBias == 0.0f));

		for (int z = 0; z < numSlicesOrFaces; z++)
		for (int y = 0; y < imageSize.y(); y++)
		for (int x = 0; x < imageSize.x(); x++)
		{
			const IVec4 color(x^y^z, (imageSize.x()-1-x)^y^z, x^(imageSize.y()-1-y)^z, (imageSize.x()-1-x)^(imageSize.y()-1-y)^z);

			if (isIntegerFormat)
				reference.setPixel(x, y, z, color);
			else
				reference.setPixel(x, y, z, color.asFloat()*storeColorScale + storeColorBias);
		}

		const bool compareOk = readTextureAndVerify(renderCtx, glLog, *texture, *textureBuf, m_textureType, m_format, imageSize, ImageLayerComparer(reference));

		m_testCtx.setTestResult(compareOk ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, compareOk ? "Pass" : "Image comparison failed");
		return STOP;
	}
}